

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.cpp
# Opt level: O2

optional<int> __thiscall rtb::Concurrency::Queue<int>::pop(Queue<int> *this)

{
  _Optional_base<int,_true,_true> _Var1;
  bool bVar2;
  pthread_t pVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  unique_lock<std::mutex> mlock;
  key_type local_48;
  unique_lock<std::mutex> local_40;
  
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->mutex_);
  pVar3 = pthread_self();
  while( true ) {
    local_48._M_thread = pVar3;
    pmVar4 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&this->subscribersMissingRead_,&local_48);
    if (*pmVar4 != 0) break;
    std::condition_variable::wait((unique_lock *)&this->cond_);
  }
  local_48._M_thread = pVar3;
  pmVar5 = std::
           map<std::thread::id,_std::_List_iterator<std::optional<int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
           ::operator[](&this->subscribersNextRead_,&local_48);
  _Var1._M_payload.super__Optional_payload_base<int> =
       (_Optional_payload<int,_true,_true,_true>)pmVar5->_M_node[1]._M_next;
  local_48._M_thread = pVar3;
  pmVar5 = std::
           map<std::thread::id,_std::_List_iterator<std::optional<int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
           ::operator[](&this->subscribersNextRead_,&local_48);
  pmVar5->_M_node = pmVar5->_M_node->_M_next;
  local_48._M_thread = pVar3;
  pmVar4 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&this->subscribersMissingRead_,&local_48);
  *pmVar4 = *pmVar4 + -1;
  bVar2 = someoneSlowerThanMe(this);
  if (!bVar2) {
    std::__cxx11::list<std::optional<int>,_std::allocator<std::optional<int>_>_>::pop_front
              (&this->queue_);
  }
  std::unique_lock<std::mutex>::unlock(&local_40);
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return (_Optional_base<int,_true,_true>)
         (_Optional_base<int,_true,_true>)_Var1._M_payload.super__Optional_payload_base<int>;
}

Assistant:

std::optional<T> Queue<T>::pop() {
        std::unique_lock<std::mutex> mlock(mutex_);
        while (subscribersMissingRead_[std::this_thread::get_id()] == 0) {
            cond_.wait(mlock);
        }
        auto val{ *subscribersNextRead_[std::this_thread::get_id()] };
        // advance iterator (maybe goes to .end())
        subscribersNextRead_[std::this_thread::get_id()]++;
        subscribersMissingRead_[std::this_thread::get_id()]--;

        if (!someoneSlowerThanMe()) { queue_.pop_front(); }

        mlock.unlock();
        return val;
    }